

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block_graph.cpp
# Opt level: O0

IRT * __thiscall IRT::getFalseLabel_abi_cxx11_(IRT *this,CStatementList *basicBlock)

{
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *pvVar1;
  size_type sVar2;
  const_reference this_00;
  CLabelStatement *this_01;
  CJumpConditionalStatement *local_78;
  CLabel local_48;
  CJumpConditionalStatement *local_28;
  CJumpConditionalStatement *cjump;
  CStatement *lastStm;
  CStatementList *basicBlock_local;
  
  lastStm = &basicBlock->super_CStatement;
  basicBlock_local = (CStatementList *)this;
  if (basicBlock == (CStatementList *)0x0) {
    __assert_fail("basicBlock != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                  ,0x24,"std::string IRT::getFalseLabel(const CStatementList *)");
  }
  pvVar1 = CStatementList::Statements(basicBlock);
  sVar2 = std::
          vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
          ::size(pvVar1);
  if (sVar2 != 0) {
    pvVar1 = CStatementList::Statements((CStatementList *)lastStm);
    this_00 = std::
              vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
              ::back(pvVar1);
    cjump = (CJumpConditionalStatement *)
            std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::get
                      (this_00);
    if (cjump == (CJumpConditionalStatement *)0x0) {
      local_78 = (CJumpConditionalStatement *)0x0;
    }
    else {
      local_78 = (CJumpConditionalStatement *)
                 __dynamic_cast(cjump,&CStatement::typeinfo,&CJumpConditionalStatement::typeinfo,0);
    }
    local_28 = local_78;
    if (local_78 != (CJumpConditionalStatement *)0x0) {
      this_01 = CJumpConditionalStatement::FalseLabel(local_78);
      CLabelStatement::Label(&local_48,this_01);
      CLabel::ToString_abi_cxx11_((CLabel *)this);
      CLabel::~CLabel(&local_48);
      return this;
    }
    __assert_fail("cjump != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                  ,0x28,"std::string IRT::getFalseLabel(const CStatementList *)");
  }
  __assert_fail("basicBlock->Statements().size() != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                ,0x25,"std::string IRT::getFalseLabel(const CStatementList *)");
}

Assistant:

std::string getFalseLabel(const CStatementList* basicBlock) {
        assert(basicBlock != nullptr);
        assert(basicBlock->Statements().size() != 0);
        const CStatement* lastStm = basicBlock->Statements().back().get();
        const CJumpConditionalStatement* cjump = dynamic_cast<const CJumpConditionalStatement*>(lastStm);
        assert(cjump != nullptr);

        return cjump->FalseLabel()->Label().ToString();
    }